

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O3

void __thiscall PrintVisitor::visit(PrintVisitor *this,AssignmentNode *node)

{
  element_type *peVar1;
  ostream *poVar2;
  const_iterator cVar3;
  undefined8 uVar4;
  PrintVisitor visitor;
  long *local_60;
  long local_58;
  long local_50 [2];
  undefined **local_40;
  ostream *local_38;
  int local_30;
  
  poVar2 = this->stream_;
  local_60 = local_50;
  std::__cxx11::string::_M_construct((ulong)&local_60,(char)this->indentation_);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_60,local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"AssignmentNode:\n",0x10);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  poVar2 = this->stream_;
  local_60 = local_50;
  std::__cxx11::string::_M_construct((ulong)&local_60,(char)this->indentation_);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_60,local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Name: ",6);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(node->name_)._M_dataplus._M_p,(node->name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  poVar2 = this->stream_;
  local_60 = local_50;
  std::__cxx11::string::_M_construct((ulong)&local_60,(char)this->indentation_);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_60,local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Operator: ",10);
  cVar3 = std::
          _Hashtable<AssignmentOperator,_std::pair<const_AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<AssignmentOperator>,_std::hash<AssignmentOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&AssignmentOperationNames_abi_cxx11_._M_h,&node->operator_);
  if (cVar3.
      super__Node_iterator_base<std::pair<const_AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,*(char **)((long)cVar3.
                                                super__Node_iterator_base<std::pair<const_AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                                ._M_cur + 0x10),
                        *(long *)((long)cVar3.
                                        super__Node_iterator_base<std::pair<const_AssignmentOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                        ._M_cur + 0x18));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    if (local_60 != local_50) {
      operator_delete(local_60,local_50[0] + 1);
    }
    poVar2 = this->stream_;
    local_30 = this->indentation_ + 1;
    local_40 = &PTR__Visitor_001e93c0;
    local_60 = local_50;
    local_38 = poVar2;
    std::__cxx11::string::_M_construct((ulong)&local_60,(char)this->indentation_);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_60,local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Value:\n",7);
    if (local_60 != local_50) {
      operator_delete(local_60,local_50[0] + 1);
    }
    peVar1 = (node->value_).super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*(peVar1->super_Node)._vptr_Node[2])(peVar1,&local_40);
    return;
  }
  uVar4 = std::__throw_out_of_range("_Map_base::at");
  _Unwind_Resume(uVar4);
}

Assistant:

void PrintVisitor::visit(const AssignmentNode& node)
{
  stream_ << indent() << "AssignmentNode:\n";
  stream_ << indent() << "Name: " << node.getName() << "\n";
  stream_ << indent() << "Operator: " << 
    AssignmentOperationNames.at(node.getOperation()) << "\n";

  auto visitor = PrintVisitor{stream_, indentation_ + 1};
  stream_ << indent() << "Value:\n";
  node.getValue()->accept(visitor);
}